

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SSBOBarrierCase::iterate(SSBOBarrierCase *this)

{
  size_type *psVar1;
  int iVar2;
  int iVar3;
  RenderContext *pRVar4;
  glUniform1uiFunc p_Var5;
  ContextType type;
  GLSLVersion version;
  int iVar6;
  GLuint GVar7;
  GLenum GVar8;
  deUint32 dVar9;
  GLint GVar10;
  char *pcVar11;
  ostream *poVar12;
  ProgramSources *pPVar13;
  undefined4 extraout_var;
  TestLog *log;
  TestError *pTVar14;
  uint uVar15;
  ulong uVar16;
  allocator<char> local_6e1;
  Buffer tempBuffer;
  Buffer outputBuffer;
  BufferMemMap bufMap_1;
  InterfaceVariableInfo valueInfo_1;
  ShaderProgram program1;
  InterfaceVariableInfo valueInfo;
  ShaderProgram program0;
  ostringstream src1;
  ostringstream src0;
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar11 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src0);
  poVar12 = std::operator<<((ostream *)&src0,pcVar11);
  poVar12 = std::operator<<(poVar12,"\n");
  std::operator<<(poVar12,
                  "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(binding = 1) buffer Output {\n    uint values[];\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    values[offset] = u_baseVal+offset;\n}\n"
                 );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src1);
  poVar12 = std::operator<<(&src1.super_basic_ostream<char,_std::char_traits<char>_>,pcVar11);
  poVar12 = std::operator<<(poVar12,"\n");
  std::operator<<(poVar12,
                  "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(binding = 1) buffer Input {\n    uint values[];\n};\nlayout(binding = 0) buffer Output {\n    coherent uint sum;\n};\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    uint value  = values[offset];\n    atomicAdd(sum, value);\n}\n"
                 );
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&valueInfo,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&program1,&valueInfo_1.name);
  pPVar13 = glu::ProgramSources::operator<<((ProgramSources *)&valueInfo,(ShaderSource *)&program1);
  glu::ShaderProgram::ShaderProgram(&program0,pRVar4,pPVar13);
  std::__cxx11::string::~string
            ((string *)
             &program1.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&valueInfo_1);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&valueInfo);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&valueInfo,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&valueInfo_1,(string *)&tempBuffer);
  pPVar13 = glu::ProgramSources::operator<<
                      ((ProgramSources *)&valueInfo,(ShaderSource *)&valueInfo_1);
  glu::ShaderProgram::ShaderProgram(&program1,pRVar4,pPVar13);
  std::__cxx11::string::~string((string *)&valueInfo_1.name._M_string_length);
  std::__cxx11::string::~string((string *)&tempBuffer);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&valueInfo);
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&tempBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  log = glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        &program0);
  glu::operator<<(log,&program1);
  if ((program0.m_program.m_info.linkOk != true) || (program1.m_program.m_info.linkOk == false)) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x2eb);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  valueInfo.name._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  psVar1 = &valueInfo.name._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
  std::operator<<((ostream *)psVar1,"Work groups: ");
  tcu::operator<<((ostream *)psVar1,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&valueInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  GVar7 = (*gl->getProgramResourceIndex)(program0.m_program.m_program,0x92e5,"values[0]");
  glu::getProgramInterfaceVariableInfo(&valueInfo,gl,program0.m_program.m_program,0x92e5,GVar7);
  iVar6 = (this->m_workSize).m_data[0];
  iVar2 = (this->m_workSize).m_data[1];
  iVar3 = (this->m_workSize).m_data[2];
  (*gl->bindBuffer)(0x90d2,tempBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)(uint)(iVar2 * iVar3 * iVar6 * valueInfo.arrayStride),(void *)0x0,
                    0x88e4);
  (*gl->bindBufferBase)(0x90d2,1,tempBuffer.super_ObjectWrapper.m_object);
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"Temp buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x2f8);
  std::__cxx11::string::~string((string *)&valueInfo);
  GVar7 = (*gl->getProgramResourceIndex)(program1.m_program.m_program,0x92e6,"Output");
  dVar9 = glu::getProgramResourceUint(gl,program1.m_program.m_program,0x92e6,GVar7,0x9303);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar9,(void *)0x0,0x88e1);
  BufferMemMap::BufferMemMap((BufferMemMap *)&valueInfo,gl,0x90d2,0,dVar9,2);
  memset((void *)valueInfo.name.field_2._M_allocated_capacity,0,(long)(int)dVar9);
  BufferMemMap::~BufferMemMap((BufferMemMap *)&valueInfo);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x309);
  (*gl->useProgram)(program0.m_program.m_program);
  p_Var5 = gl->uniform1ui;
  GVar10 = (*gl->getUniformLocation)(program0.m_program.m_program,"u_baseVal");
  (*p_Var5)(GVar10,0x7f);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  (*gl->memoryBarrier)(0x2000);
  (*gl->useProgram)(program1.m_program.m_program);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"Failed to dispatch commands",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x313);
  GVar7 = (*gl->getProgramResourceIndex)(program1.m_program.m_program,0x92e6,"Output");
  dVar9 = glu::getProgramResourceUint(gl,program1.m_program.m_program,0x92e6,GVar7,0x9303);
  GVar7 = (*gl->getProgramResourceIndex)(program1.m_program.m_program,0x92e5,"sum");
  glu::getProgramInterfaceVariableInfo(&valueInfo_1,gl,program1.m_program.m_program,0x92e5,GVar7);
  uVar16 = 0;
  BufferMemMap::BufferMemMap(&bufMap_1,gl,0x90d2,0,dVar9,1);
  uVar15 = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0] *
           (this->m_workSize).m_data[2];
  if (0 < (int)uVar15) {
    uVar16 = (ulong)uVar15;
  }
  if (*(int *)((long)bufMap_1.m_ptr + (ulong)valueInfo_1.offset) ==
      (int)uVar16 * 0x7f + (int)(((int)uVar16 - 1) * uVar16 >> 1)) {
    BufferMemMap::~BufferMemMap(&bufMap_1);
    std::__cxx11::string::~string((string *)&valueInfo_1);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&tempBuffer.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram(&program1);
    glu::ShaderProgram::~ShaderProgram(&program0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src0);
    return STOP;
  }
  valueInfo.name._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  psVar1 = &valueInfo.name._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
  std::operator<<((ostream *)psVar1,"ERROR: comparison failed, expected ");
  std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
  std::operator<<((ostream *)psVar1,", got ");
  std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&valueInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valueInfo,"Comparison failed",&local_6e1);
  tcu::TestError::TestError(pTVar14,&valueInfo.name);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion				= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const char* const	glslVersionDeclaration	= getGLSLVersionDeclaration(glslVersion);

		std::ostringstream src0;
		src0 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(binding = 1) buffer Output {\n"
						  "    uint values[];\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    values[offset] = u_baseVal+offset;\n"
				"}\n";

		std::ostringstream src1;
		src1 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(binding = 1) buffer Input {\n"
						  "    uint values[];\n"
						  "};\n"
						  "layout(binding = 0) buffer Output {\n"
						  "    coherent uint sum;\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    uint value  = values[offset];\n"
						  "    atomicAdd(sum, value);\n"
				"}\n";

		const ShaderProgram			program0		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src0.str()));
		const ShaderProgram			program1		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src1.str()));

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				tempBuffer		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const deUint32				baseValue		= 127;

		m_testCtx.getLog() << program0 << program1;
		if (!program0.isOk() || !program1.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		// Temp buffer setup
		{
			const deUint32				valueIndex		= gl.getProgramResourceIndex(program0.getProgram(), GL_BUFFER_VARIABLE, "values[0]");
			const InterfaceVariableInfo	valueInfo		= getProgramInterfaceVariableInfo(gl, program0.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const deUint32				bufferSize		= valueInfo.arrayStride*m_workSize[0]*m_workSize[1]*m_workSize[2];

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *tempBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)bufferSize, DE_NULL, GL_STATIC_DRAW);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *tempBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Temp buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_WRITE_BIT);
				deMemset(bufMap.getPtr(), 0, blockSize);
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.useProgram(program0.getProgram());
		gl.uniform1ui(gl.getUniformLocation(program0.getProgram(), "u_baseVal"), baseValue);
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		gl.memoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		gl.useProgram(program1.getProgram());
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch commands");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_BUFFER_VARIABLE, "sum");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program1.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			const deUint32				res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset));
			deUint32					ref			= 0;

			for (int ndx = 0; ndx < m_workSize[0]*m_workSize[1]*m_workSize[2]; ndx++)
				ref += baseValue + (deUint32)ndx;

			if (res != ref)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed, expected " << ref << ", got " << res << TestLog::EndMessage;
				throw tcu::TestError("Comparison failed");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}